

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

void __thiscall PhPacker_Arg_P_Test::~PhPacker_Arg_P_Test(PhPacker_Arg_P_Test *this)

{
  PhPacker_Arg_P_Test *this_local;
  
  ~PhPacker_Arg_P_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(PhPacker, Arg_P)
{
   std::string str = PhPacker::pack<uint64_t>('P', 65535123424ull);
   uint64_t result = std::any_cast<uint64_t>(PhPacker::unpack('P', str));
   uint64_t expected = 65535123424ull;
   GTEST_ASSERT_EQ(result, expected);

   str = PhPacker::pack<uint64_t>('P', 65ull);
   result = std::any_cast<uint64_t>(PhPacker::unpack('P', str));
   expected = 65ull;
   GTEST_ASSERT_EQ(result, expected);

   str = PhPacker::pack<uint64_t>('P', std::numeric_limits<uint64_t>::min());
   result = std::any_cast<uint64_t>(PhPacker::unpack('P', str));
   expected = std::numeric_limits<uint64_t>::min();
   GTEST_ASSERT_EQ(result, expected);

   str = PhPacker::pack<uint64_t>('P', std::numeric_limits<uint64_t>::max());
   result = std::any_cast<uint64_t>(PhPacker::unpack('P', str));
   expected = std::numeric_limits<uint64_t>::max();
   GTEST_ASSERT_EQ(result, expected);
}